

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_open_uri.cxx
# Opt level: O3

void fl_decode_uri(char *uri)

{
  int iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  int h;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar2 = strlen(uri);
  pcVar4 = uri + (sVar2 - 2);
  if (uri < pcVar4) {
    pcVar5 = uri + sVar2;
    lVar3 = -2 - (long)uri;
    do {
      if (*uri == '%') {
        iVar1 = __isoc99_sscanf(uri + 1,"%2X",(long)&uStack_38 + 4);
        if (iVar1 != 1) {
          return;
        }
        *uri = uStack_38._4_1_;
        memmove(uri + 1,uri + 3,(size_t)(pcVar5 + lVar3));
        pcVar5 = pcVar4;
      }
      uri = uri + 1;
      pcVar4 = pcVar5 + -2;
      lVar3 = lVar3 + -1;
    } while (uri < pcVar4);
  }
  return;
}

Assistant:

void fl_decode_uri(char *uri)
{
  char *last = uri + strlen(uri);
  while (uri < last-2) {
    if (*uri == '%') {
      int h;
      if ( sscanf(uri+1, "%2X", &h) != 1 ) break;
      *uri = h;
      memmove(uri+1, uri+3, last - (uri+2));
      last -= 2;
    }
    uri++;
  }
}